

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::LaxPolygonLayer::AppendPolygonLoops
          (LaxPolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops,
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          *loops)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  reference piVar2;
  Edge *pEVar3;
  S2Point *__x;
  const_iterator cStack_88;
  int edge_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_60 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  vector<int,_std::allocator<int>_> *edge_loop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  *loops_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *edge_loops_local;
  Graph *g_local;
  LaxPolygonLayer *this_local;
  
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(edge_loops);
  edge_loop = (vector<int,_std::allocator<int>_> *)
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::end(edge_loops);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&edge_loop);
    if (!bVar1) break;
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_60);
    __n = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_60,__n);
    this_00 = vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)
                        vertices.
                        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    cStack_88 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78);
      if (!bVar1) break;
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      pEVar3 = S2Builder::Graph::edge(g,*piVar2);
      __x = S2Builder::Graph::vertex(g,pEVar3->first);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_60,__x);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::
    vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
    ::push_back(loops,(value_type *)local_60);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_60);
    __gnu_cxx::
    __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void LaxPolygonLayer::AppendPolygonLoops(
    const Graph& g, const vector<Graph::EdgeLoop>& edge_loops,
    vector<vector<S2Point>>* loops) const {
  for (const auto& edge_loop : edge_loops) {
    vector<S2Point> vertices;
    vertices.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      vertices.push_back(g.vertex(g.edge(edge_id).first));
    }
    loops->push_back(std::move(vertices));
  }
}